

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O3

void __thiscall
spvtools::val::ValidationState_t::ValidationState_t
          (ValidationState_t *this,spv_const_context ctx,spv_const_validator_options opt,
          uint32_t *words,size_t num_words,uint32_t max_warnings)

{
  _Rb_tree_header *p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  spv_target_env env;
  _Manager_type p_Var4;
  bool bVar5;
  FriendlyNameMapper *this_00;
  undefined1 auVar6 [16];
  _Any_data local_98;
  spv_operand_table local_88;
  spv_ext_inst_table psStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type local_40;
  
  this->context_ = ctx;
  this->options_ = opt;
  this->words_ = words;
  this->num_words_ = num_words;
  this->total_functions_ = 0;
  (this->unresolved_forward_ids_)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->unresolved_forward_ids_)._M_h._M_bucket_count = 0;
  (this->unresolved_forward_ids_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->unresolved_forward_ids_)._M_h._M_element_count = 0;
  *(undefined8 *)&(this->unresolved_forward_ids_)._M_h._M_rehash_policy = 0;
  this->generator_ = 0;
  this->version_ = 0;
  this->total_instructions_ = 0;
  (this->unresolved_forward_ids_)._M_h._M_buckets =
       &(this->unresolved_forward_ids_)._M_h._M_single_bucket;
  (this->unresolved_forward_ids_)._M_h._M_bucket_count = 1;
  (this->unresolved_forward_ids_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->unresolved_forward_ids_)._M_h._M_element_count = 0;
  (this->unresolved_forward_ids_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->unresolved_forward_ids_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->unresolved_forward_ids_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->forward_pointer_ids_)._M_h._M_buckets = &(this->forward_pointer_ids_)._M_h._M_single_bucket
  ;
  (this->forward_pointer_ids_)._M_h._M_bucket_count = 1;
  (this->forward_pointer_ids_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->forward_pointer_ids_)._M_h._M_element_count = 0;
  (this->forward_pointer_ids_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->forward_pointer_ids_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->forward_pointer_ids_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->sampled_image_consumers_)._M_h._M_buckets =
       &(this->sampled_image_consumers_)._M_h._M_single_bucket;
  (this->sampled_image_consumers_)._M_h._M_bucket_count = 1;
  (this->sampled_image_consumers_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->sampled_image_consumers_)._M_h._M_element_count = 0;
  (this->sampled_image_consumers_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->sampled_image_consumers_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->sampled_image_consumers_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->qcom_image_processing_consumers_)._M_h._M_buckets =
       &(this->qcom_image_processing_consumers_)._M_h._M_single_bucket;
  (this->qcom_image_processing_consumers_)._M_h._M_bucket_count = 1;
  (this->qcom_image_processing_consumers_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->qcom_image_processing_consumers_)._M_h._M_element_count = 0;
  (this->qcom_image_processing_consumers_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->operand_names_)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->operand_names_)._M_h._M_bucket_count = 0;
  *(undefined8 *)&(this->operand_names_)._M_h._M_rehash_policy = 0;
  (this->operand_names_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->operand_names_)._M_h._M_element_count = 0;
  (this->qcom_image_processing_consumers_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->qcom_image_processing_consumers_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->operand_names_)._M_h._M_buckets = &(this->operand_names_)._M_h._M_single_bucket;
  (this->operand_names_)._M_h._M_bucket_count = 1;
  (this->operand_names_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->operand_names_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->operand_names_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->current_layout_section_ = kLayoutCapabilities;
  memset(&this->module_functions_,0,0x98);
  (this->all_definitions_)._M_h._M_buckets = &(this->all_definitions_)._M_h._M_single_bucket;
  (this->all_definitions_)._M_h._M_bucket_count = 1;
  (this->all_definitions_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->all_definitions_)._M_h._M_element_count = 0;
  (this->all_definitions_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->all_definitions_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->all_definitions_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->entry_point_descriptions_)._M_h._M_buckets =
       &(this->entry_point_descriptions_)._M_h._M_single_bucket;
  (this->entry_point_descriptions_)._M_h._M_bucket_count = 1;
  (this->entry_point_descriptions_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->entry_point_descriptions_)._M_h._M_element_count = 0;
  (this->entry_point_descriptions_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->entry_point_descriptions_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->entry_point_descriptions_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->recursive_entry_points_)._M_t._M_impl.super__Rb_tree_header;
  (this->recursive_entry_points_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->recursive_entry_points_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->recursive_entry_points_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->recursive_entry_points_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->recursive_entry_points_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->function_call_targets_)._M_h._M_buckets =
       &(this->function_call_targets_)._M_h._M_single_bucket;
  (this->function_call_targets_)._M_h._M_bucket_count = 1;
  (this->function_call_targets_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->function_call_targets_)._M_h._M_element_count = 0;
  (this->function_call_targets_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->function_call_targets_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->function_call_targets_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)&(this->global_vars_)._M_h._M_rehash_policy = 0;
  (this->global_vars_)._M_h._M_buckets = &(this->global_vars_)._M_h._M_single_bucket;
  (this->global_vars_)._M_h._M_bucket_count = 1;
  (this->global_vars_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->global_vars_)._M_h._M_element_count = 0;
  (this->global_vars_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->local_vars_)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->local_vars_)._M_h._M_bucket_count = 0;
  *(undefined8 *)&(this->local_vars_)._M_h._M_rehash_policy = 0;
  (this->global_vars_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->global_vars_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->local_vars_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->local_vars_)._M_h._M_element_count = 0;
  (this->local_vars_)._M_h._M_buckets = &(this->local_vars_)._M_h._M_single_bucket;
  (this->local_vars_)._M_h._M_bucket_count = 1;
  (this->local_vars_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->local_vars_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->local_vars_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->builtin_structs_)._M_h._M_buckets = &(this->builtin_structs_)._M_h._M_single_bucket;
  (this->builtin_structs_)._M_h._M_bucket_count = 1;
  (this->builtin_structs_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->builtin_structs_)._M_h._M_element_count = 0;
  (this->builtin_structs_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->builtin_structs_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->builtin_structs_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->struct_nesting_depth_)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->struct_nesting_depth_)._M_h._M_bucket_count = 0;
  (this->struct_nesting_depth_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->struct_nesting_depth_)._M_h._M_element_count = 0;
  *(undefined8 *)&(this->struct_nesting_depth_)._M_h._M_rehash_policy = 0;
  (this->struct_nesting_depth_)._M_h._M_buckets =
       &(this->struct_nesting_depth_)._M_h._M_single_bucket;
  (this->struct_nesting_depth_)._M_h._M_bucket_count = 1;
  (this->struct_nesting_depth_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->struct_nesting_depth_)._M_h._M_element_count = 0;
  (this->struct_nesting_depth_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->struct_has_nested_blockorbufferblock_struct_)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->struct_has_nested_blockorbufferblock_struct_)._M_h._M_bucket_count = 0;
  *(undefined8 *)&(this->struct_has_nested_blockorbufferblock_struct_)._M_h._M_rehash_policy = 0;
  (this->struct_nesting_depth_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->struct_nesting_depth_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->struct_has_nested_blockorbufferblock_struct_)._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->struct_has_nested_blockorbufferblock_struct_)._M_h._M_element_count = 0;
  (this->struct_has_nested_blockorbufferblock_struct_)._M_h._M_buckets =
       &(this->struct_has_nested_blockorbufferblock_struct_)._M_h._M_single_bucket;
  (this->struct_has_nested_blockorbufferblock_struct_)._M_h._M_bucket_count = 1;
  (this->struct_has_nested_blockorbufferblock_struct_)._M_h._M_rehash_policy._M_max_load_factor =
       1.0;
  (this->struct_has_nested_blockorbufferblock_struct_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->struct_has_nested_blockorbufferblock_struct_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->id_decorations_)._M_t._M_impl.super__Rb_tree_header;
  (this->id_decorations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->id_decorations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->id_decorations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->id_decorations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->id_decorations_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->unique_type_declarations_)._M_t._M_impl.super__Rb_tree_header;
  (this->unique_type_declarations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->unique_type_declarations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->unique_type_declarations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->unique_type_declarations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->unique_type_declarations_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->grammar_).target_env_ = ctx->target_env;
  uVar2 = ctx->opcode_table;
  uVar3 = ctx->operand_table;
  auVar6._8_4_ = (int)uVar2;
  auVar6._0_8_ = uVar3;
  auVar6._12_4_ = (int)((ulong)uVar2 >> 0x20);
  (this->grammar_).operandTable_ = (spv_operand_table)uVar3;
  (this->grammar_).opcodeTable_ = (spv_opcode_table)auVar6._8_8_;
  (this->grammar_).extInstTable_ = ctx->ext_inst_table;
  this->addressing_model_ = AddressingModelMax;
  this->memory_model_ = Max;
  this->pointer_size_and_alignment_ = 0;
  this->sampler_image_addressing_mode_ = 0;
  this->in_function_ = false;
  (this->features_).declare_int16_type = false;
  (this->features_).declare_float16_type = false;
  (this->features_).free_fp_rounding_mode = false;
  (this->features_).variable_pointers = false;
  (this->features_).group_ops_reduce_and_scans = false;
  (this->features_).declare_int8_type = false;
  (this->features_).env_relaxed_block_layout = false;
  (this->features_).declare_int8_type = false;
  (this->features_).env_relaxed_block_layout = false;
  (this->features_).use_int8_type = false;
  (this->features_).select_between_composites = false;
  (this->features_).copy_memory_permits_two_memory_accesses = false;
  (this->features_).uconvert_spec_constant_op = false;
  (this->features_).nonwritable_var_in_function_or_private = false;
  (this->features_).env_allow_localsizeid = false;
  (this->id_to_function_)._M_h._M_buckets = &(this->id_to_function_)._M_h._M_single_bucket;
  (this->id_to_function_)._M_h._M_bucket_count = 1;
  (this->id_to_function_)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->id_to_function_)._M_h._M_element_count = 0;
  (this->id_to_function_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->id_to_function_)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  (this->entry_point_to_execution_models_)._M_h._M_buckets =
       &(this->entry_point_to_execution_models_)._M_h._M_single_bucket;
  (this->entry_point_to_execution_models_)._M_h._M_bucket_count = 1;
  (this->entry_point_to_execution_models_)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->entry_point_to_execution_models_)._M_h._M_element_count = 0;
  (this->entry_point_to_execution_models_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])
   &(this->entry_point_to_execution_models_)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  (this->entry_point_to_execution_modes_)._M_h._M_buckets =
       &(this->entry_point_to_execution_modes_)._M_h._M_single_bucket;
  (this->entry_point_to_execution_modes_)._M_h._M_bucket_count = 1;
  (this->entry_point_to_execution_modes_)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->entry_point_to_execution_modes_)._M_h._M_element_count = 0;
  (this->entry_point_to_execution_modes_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])
   &(this->entry_point_to_execution_modes_)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  (this->entry_point_to_local_size_or_id_)._M_h._M_buckets =
       &(this->entry_point_to_local_size_or_id_)._M_h._M_single_bucket;
  (this->entry_point_to_local_size_or_id_)._M_h._M_bucket_count = 1;
  (this->entry_point_to_local_size_or_id_)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->entry_point_to_local_size_or_id_)._M_h._M_element_count = 0;
  (this->entry_point_to_local_size_or_id_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])
   &(this->entry_point_to_local_size_or_id_)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  (this->entry_point_to_output_primitives_)._M_h._M_buckets =
       &(this->entry_point_to_output_primitives_)._M_h._M_single_bucket;
  (this->entry_point_to_output_primitives_)._M_h._M_bucket_count = 1;
  (this->entry_point_to_output_primitives_)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->entry_point_to_output_primitives_)._M_h._M_element_count = 0;
  (this->entry_point_to_output_primitives_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])
   &(this->entry_point_to_output_primitives_)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  (this->function_to_entry_points_)._M_h._M_buckets =
       &(this->function_to_entry_points_)._M_h._M_single_bucket;
  (this->function_to_entry_points_)._M_h._M_bucket_count = 1;
  (this->function_to_entry_points_)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->function_to_entry_points_)._M_h._M_element_count = 0;
  (this->function_to_entry_points_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->empty_ids_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->empty_ids_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->empty_ids_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])&(this->function_to_entry_points_)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  (this->pointer_to_uniform_block_)._M_h._M_buckets =
       &(this->pointer_to_uniform_block_)._M_h._M_single_bucket;
  (this->pointer_to_uniform_block_)._M_h._M_bucket_count = 1;
  (this->pointer_to_uniform_block_)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->pointer_to_uniform_block_)._M_h._M_element_count = 0;
  (this->pointer_to_uniform_block_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->pointer_to_uniform_block_)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  (this->struct_for_uniform_block_)._M_h._M_buckets =
       &(this->struct_for_uniform_block_)._M_h._M_single_bucket;
  (this->struct_for_uniform_block_)._M_h._M_bucket_count = 1;
  (this->struct_for_uniform_block_)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->struct_for_uniform_block_)._M_h._M_element_count = 0;
  (this->struct_for_uniform_block_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->struct_for_uniform_block_)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  (this->pointer_to_storage_buffer_)._M_h._M_buckets =
       &(this->pointer_to_storage_buffer_)._M_h._M_single_bucket;
  (this->pointer_to_storage_buffer_)._M_h._M_bucket_count = 1;
  (this->pointer_to_storage_buffer_)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->pointer_to_storage_buffer_)._M_h._M_element_count = 0;
  (this->pointer_to_storage_buffer_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->pointer_to_storage_buffer_)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  (this->struct_for_storage_buffer_)._M_h._M_buckets =
       &(this->struct_for_storage_buffer_)._M_h._M_single_bucket;
  (this->struct_for_storage_buffer_)._M_h._M_bucket_count = 1;
  (this->struct_for_storage_buffer_)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->struct_for_storage_buffer_)._M_h._M_element_count = 0;
  (this->struct_for_storage_buffer_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->struct_for_storage_buffer_)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  (this->pointer_to_storage_image_)._M_h._M_buckets =
       &(this->pointer_to_storage_image_)._M_h._M_single_bucket;
  (this->pointer_to_storage_image_)._M_h._M_bucket_count = 1;
  (this->pointer_to_storage_image_)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->pointer_to_storage_image_)._M_h._M_element_count = 0;
  (this->pointer_to_storage_image_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])((long)&(this->name_mapper_).super__Function_base._M_manager + 4) =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&(this->name_mapper_).super__Function_base._M_functor + 8) =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])&this->friendly_mapper_ = (undefined1  [16])0x0;
  *(undefined1 (*) [16])&(this->pointer_to_storage_image_)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  this->max_num_of_warnings_ = max_warnings;
  if (opt != (spv_const_validator_options)0x0) {
    env = this->context_->target_env;
    bVar5 = spvIsVulkanEnv(env);
    if (env != SPV_ENV_VULKAN_1_0 && bVar5) {
      (this->features_).env_relaxed_block_layout = true;
    }
    if ((env < SPV_ENV_UNIVERSAL_1_6) &&
       ((0xa40002U >> (env & (SPV_ENV_UNIVERSAL_1_6|SPV_ENV_OPENGL_4_2)) & 1) != 0)) {
      bVar5 = false;
    }
    else {
      bVar5 = true;
    }
    (this->features_).env_allow_localsizeid = bVar5;
    if (num_words != 0) {
      local_98._M_unused._0_8_ = (undefined8)*(undefined8 *)ctx;
      local_98._8_8_ = ctx->opcode_table;
      local_88 = ctx->operand_table;
      psStack_80 = ctx->ext_inst_table;
      local_78._M_unused._M_object = (void *)0x0;
      local_78._8_8_ = 0;
      local_68 = (code *)0x0;
      pcStack_60 = (code *)0x0;
      p_Var4 = (ctx->consumer).super__Function_base._M_manager;
      if (p_Var4 == (_Manager_type)0x0) {
        local_40 = (_Invoker_type)0x0;
        local_48 = (_Manager_type)0x0;
      }
      else {
        (*p_Var4)(&local_78,(_Any_data *)&ctx->consumer,__clone_functor);
        local_48 = (ctx->consumer).super__Function_base._M_manager;
        local_40 = (ctx->consumer)._M_invoker;
      }
      local_58._M_unused._M_object = local_78._M_unused._M_object;
      local_58._8_8_ = local_78._8_8_;
      local_78._M_unused._M_object = (void *)0x0;
      local_78._8_8_ = 0;
      local_68 = std::
                 _Function_handler<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validation_state.cpp:209:33)>
                 ::_M_manager;
      pcStack_60 = std::
                   _Function_handler<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validation_state.cpp:209:33)>
                   ::_M_invoke;
      if (local_48 != (_Manager_type)0x0) {
        (*local_48)(&local_58,&local_58,__destroy_functor);
      }
      spvBinaryParse((spv_const_context)&local_98,this,words,num_words,anon_unknown_11::setHeader,
                     anon_unknown_11::CountInstructions,(spv_diagnostic *)0x0);
      std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>::reserve
                (&this->ordered_instructions_,this->total_instructions_);
      std::vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>::reserve
                (&this->module_functions_,this->total_functions_);
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,__destroy_functor);
      }
    }
    if (0x103ff < this->version_) {
      (this->features_).select_between_composites = true;
      (this->features_).copy_memory_permits_two_memory_accesses = true;
      (this->features_).uconvert_spec_constant_op = true;
      (this->features_).nonwritable_var_in_function_or_private = true;
    }
    GetTrivialNameMapper_abi_cxx11_();
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
    ::operator=(&this->name_mapper_,
                (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
                 *)&local_98);
    if (local_88 != (spv_operand_table)0x0) {
      (*(code *)local_88)(&local_98,&local_98,3);
    }
    if (this->options_->use_friendly_names == true) {
      this_00 = (FriendlyNameMapper *)operator_new(0x90);
      FriendlyNameMapper::FriendlyNameMapper(this_00,this->context_,this->words_,this->num_words_);
      std::
      __uniq_ptr_impl<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
      ::reset((__uniq_ptr_impl<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
               *)&this->friendly_mapper_,this_00);
      local_98._M_unused._M_object =
           (this->friendly_mapper_)._M_t.
           super___uniq_ptr_impl<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::FriendlyNameMapper_*,_std::default_delete<spvtools::FriendlyNameMapper>_>
           .super__Head_base<0UL,_spvtools::FriendlyNameMapper_*,_false>._M_head_impl;
      local_98._8_8_ = 0;
      psStack_80 = (spv_ext_inst_table)
                   std::
                   _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/name_mapper.h:73:12)>
                   ::_M_invoke;
      local_88 = (spv_operand_table)
                 std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/name_mapper.h:73:12)>
                 ::_M_manager;
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
      ::operator=(&this->name_mapper_,
                  (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
                   *)&local_98);
      if (local_88 != (spv_operand_table)0x0) {
        (*(code *)local_88)(&local_98,&local_98,3);
      }
    }
    return;
  }
  __assert_fail("opt && \"Validator options may not be Null.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validation_state.cpp"
                ,0xb1,
                "spvtools::val::ValidationState_t::ValidationState_t(const spv_const_context, const spv_const_validator_options, const uint32_t *, const size_t, const uint32_t)"
               );
}

Assistant:

ValidationState_t::ValidationState_t(const spv_const_context ctx,
                                     const spv_const_validator_options opt,
                                     const uint32_t* words,
                                     const size_t num_words,
                                     const uint32_t max_warnings)
    : context_(ctx),
      options_(opt),
      words_(words),
      num_words_(num_words),
      unresolved_forward_ids_{},
      operand_names_{},
      current_layout_section_(kLayoutCapabilities),
      module_functions_(),
      module_capabilities_(),
      module_extensions_(),
      ordered_instructions_(),
      all_definitions_(),
      global_vars_(),
      local_vars_(),
      struct_nesting_depth_(),
      struct_has_nested_blockorbufferblock_struct_(),
      grammar_(ctx),
      addressing_model_(spv::AddressingModel::Max),
      memory_model_(spv::MemoryModel::Max),
      pointer_size_and_alignment_(0),
      sampler_image_addressing_mode_(0),
      in_function_(false),
      num_of_warnings_(0),
      max_num_of_warnings_(max_warnings) {
  assert(opt && "Validator options may not be Null.");

  const auto env = context_->target_env;

  if (spvIsVulkanEnv(env)) {
    // Vulkan 1.1 includes VK_KHR_relaxed_block_layout in core.
    if (env != SPV_ENV_VULKAN_1_0) {
      features_.env_relaxed_block_layout = true;
    }
  }

  // LocalSizeId is only disallowed prior to Vulkan 1.3 without maintenance4.
  switch (env) {
    case SPV_ENV_VULKAN_1_0:
    case SPV_ENV_VULKAN_1_1:
    case SPV_ENV_VULKAN_1_1_SPIRV_1_4:
    case SPV_ENV_VULKAN_1_2:
      features_.env_allow_localsizeid = false;
      break;
    default:
      features_.env_allow_localsizeid = true;
      break;
  }

  // Only attempt to count if we have words, otherwise let the other validation
  // fail and generate an error.
  if (num_words > 0) {
    // Count the number of instructions in the binary.
    // This parse should not produce any error messages. Hijack the context and
    // replace the message consumer so that we do not pollute any state in input
    // consumer.
    spv_context_t hijacked_context = *ctx;
    hijacked_context.consumer = [](spv_message_level_t, const char*,
                                   const spv_position_t&, const char*) {};
    spvBinaryParse(&hijacked_context, this, words, num_words, setHeader,
                   CountInstructions,
                   /* diagnostic = */ nullptr);
    preallocateStorage();
  }
  UpdateFeaturesBasedOnSpirvVersion(&features_, version_);

  name_mapper_ = spvtools::GetTrivialNameMapper();
  if (options_->use_friendly_names) {
    friendly_mapper_ = spvtools::MakeUnique<spvtools::FriendlyNameMapper>(
        context_, words_, num_words_);
    name_mapper_ = friendly_mapper_->GetNameMapper();
  }
}